

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O1

double __thiscall libDAI::IJGP::run(IJGP *this)

{
  unsigned_long uVar1;
  undefined *puVar2;
  pointer puVar3;
  pointer puVar4;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  long lVar7;
  undefined4 extraout_var_00;
  size_type __n;
  undefined4 extraout_var_01;
  ulong uVar8;
  undefined4 extraout_var_02;
  undefined8 uVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  size_t sVar10;
  iterator iVar11;
  iterator iVar12;
  long lVar13;
  pointer pTVar14;
  pointer pVVar15;
  long *plVar16;
  size_t t;
  ulong uVar17;
  ulong *puVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> edge_seq;
  Diffs diffs;
  Factor nb;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  Diffs local_d0;
  TFactor<double> local_98;
  clock_t local_60;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_58;
  long local_38;
  
  if ((this->Props).verbose != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Starting ",9);
    (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(&local_d0,this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (char *)local_d0.super_vector<double,_std::allocator<double>_>.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start,
                        (long)local_d0.super_vector<double,_std::allocator<double>_>.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"...",3);
    if ((pointer *)
        local_d0.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        != &local_d0.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
      operator_delete(local_d0.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
  if (2 < (this->Props).verbose) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  local_60 = toc();
  iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x28))
                    ((long *)CONCAT44(extraout_var,iVar5));
  Diffs::Diffs(&local_d0,lVar7,1.0);
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_58.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  __n = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x28))
                  ((long *)CONCAT44(extraout_var_00,iVar5));
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (&local_58,__n);
  uVar17 = 0;
  while( true ) {
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x28))
                      ((long *)CONCAT44(extraout_var_01,iVar5));
    if (uVar8 <= uVar17) break;
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x30))
                      ((long *)CONCAT44(extraout_var_02,iVar5),uVar17);
    (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[10])
              (&local_98,this,uVar9);
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)&local_58,
               &local_98);
    if (local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar17 = uVar17 + 1;
  }
  iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&local_e8,
             *(long *)(CONCAT44(extraout_var_03,iVar5) + 0x118) -
             *(long *)(CONCAT44(extraout_var_03,iVar5) + 0x110) >> 4);
  pVVar15 = (pointer)0x0;
  while (local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
         super__Vector_impl_data._M_start = pVVar15,
        iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        , pVVar15 < (pointer)(*(long *)(CONCAT44(extraout_var_04,iVar5) + 0x118) -
                              *(long *)(CONCAT44(extraout_var_04,iVar5) + 0x110) >> 4)) {
    if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,(unsigned_long *)&local_98);
    }
    else {
      *local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish =
           (unsigned_long)
           local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    pVVar15 = (pointer)((long)&(local_98._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start)->_label + 1);
  }
  this->_iterations = 0;
  if ((this->Props).maxiter != 0) {
    do {
      puVar4 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar3 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar11._M_current = &local_d0._def;
      if (local_d0._maxsize <=
          (ulong)((long)local_d0.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_d0.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3)) {
        iVar11._M_current = local_d0._maxpos._M_current;
      }
      if (*iVar11._M_current <= (this->Props).tol) break;
      if ((((this->Props).updates.v == SEQRND) &&
          (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start !=
           local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish)) &&
         (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start + 1 !=
          local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        lVar7 = 8;
        do {
          iVar5 = rand();
          lVar13 = (long)iVar5 % ((lVar7 >> 3) + 1);
          if (lVar7 != lVar13 * 8) {
            uVar1 = *(unsigned_long *)((long)puVar3 + lVar7);
            *(unsigned_long *)((long)puVar3 + lVar7) = puVar3[lVar13];
            puVar3[lVar13] = uVar1;
          }
          lVar13 = lVar7 + 8;
          lVar7 = lVar7 + 8;
        } while ((unsigned_long *)((long)puVar3 + lVar13) != puVar4);
      }
      for (uVar17 = 0;
          iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this),
          uVar17 < (ulong)(*(long *)(CONCAT44(extraout_var_05,iVar5) + 0x118) -
                           *(long *)(CONCAT44(extraout_var_05,iVar5) + 0x110) >> 4);
          uVar17 = uVar17 + 1) {
        updateMessage(this,local_e8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar17]);
      }
      for (uVar17 = 0;
          iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this),
          uVar17 < (ulong)(*(long *)(CONCAT44(extraout_var_06,iVar5) + 0xe8) -
                           *(long *)(CONCAT44(extraout_var_06,iVar5) + 0xe0) >> 6);
          uVar17 = uVar17 + 1) {
        iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        TFactor<double>::operator=
                  ((this->_Qa).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17,
                   (TFactor<double> *)
                   (uVar17 * 0x40 + *(long *)(CONCAT44(extraout_var_07,iVar5) + 0xe0)));
        iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        local_38 = uVar17 * 3;
        for (plVar16 = *(long **)(*(long *)(CONCAT44(extraout_var_08,iVar5) + 0x140) + uVar17 * 0x18
                                 );
            iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this),
            plVar16 !=
            *(long **)(*(long *)(CONCAT44(extraout_var_09,iVar5) + 0x140) + 8 + local_38 * 8);
            plVar16 = plVar16 + 1) {
          iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          puVar18 = *(ulong **)
                     (*(long *)(CONCAT44(extraout_var_10,iVar5) + 0x158) + *plVar16 * 0x18);
          while( true ) {
            iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this);
            lVar7 = *plVar16;
            if (puVar18 ==
                *(ulong **)(*(long *)(CONCAT44(extraout_var_11,iVar5) + 0x158) + 8 + lVar7 * 0x18))
            break;
            uVar8 = *puVar18;
            if (uVar8 != uVar17) {
              iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                                (this);
              TFactor<double>::operator*=
                        ((this->_Qa).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar17,
                         (this->_mes).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                         *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_12,iVar5) + 0x128) +
                                            uVar8 * 0x18) + lVar7 * 8));
            }
            puVar18 = puVar18 + 1;
          }
        }
        TProb<double>::normalize
                  (&(this->_Qa).
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar17]._p,NORMPROB);
      }
      uVar17 = 0;
      while( true ) {
        iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if ((ulong)((*(long *)(CONCAT44(extraout_var_13,iVar5) + 0x100) -
                     *(long *)(CONCAT44(extraout_var_13,iVar5) + 0xf8) >> 3) * -0x3333333333333333)
            <= uVar17) break;
        TFactor<double>::TFactor(&local_98);
        TFactor<double>::operator=
                  ((this->_Qb).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17,&local_98);
        if (local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_98._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        for (plVar16 = *(long **)(*(long *)(CONCAT44(extraout_var_14,iVar5) + 0x158) + uVar17 * 0x18
                                 );
            iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this),
            plVar16 !=
            *(long **)(*(long *)(CONCAT44(extraout_var_15,iVar5) + 0x158) + 8 + uVar17 * 0x18);
            plVar16 = plVar16 + 1) {
          lVar7 = *plVar16;
          iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          TFactor<double>::operator*=
                    ((this->_Qb).
                     super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar17,
                     (this->_mes).
                     super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_16,iVar5) + 0x128) +
                                        lVar7 * 0x18) + uVar17 * 8));
        }
        TProb<double>::normalize
                  (&(this->_Qb).
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar17]._p,NORMPROB);
        uVar17 = uVar17 + 1;
      }
      uVar17 = 0;
      while( true ) {
        iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar5) + 0x28))
                          ((long *)CONCAT44(extraout_var_17,iVar5));
        puVar2 = Name;
        if (uVar8 <= uVar17) break;
        iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        uVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar5) + 0x30))
                          ((long *)CONCAT44(extraout_var_18,iVar5),uVar17);
        (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[10])
                  (&local_98,this,uVar9);
        dVar19 = -1.0;
        if (local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
            .super__Vector_impl_data._M_finish !=
            local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
            .super__Vector_impl_data._M_start) {
          pTVar14 = local_58.
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar17;
          dVar19 = -1.0;
          if ((pTVar14->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar14->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            if ((long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              dVar19 = 0.0;
            }
            else {
              lVar7 = (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3;
              auVar20 = ZEXT816(0);
              lVar13 = 0;
              auVar22._8_8_ = 0x7fffffffffffffff;
              auVar22._0_8_ = 0x7fffffffffffffff;
              do {
                auVar21._8_8_ = 0;
                auVar21._0_8_ =
                     local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13] -
                     (pTVar14->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13];
                auVar21 = vandpd_avx(auVar21,auVar22);
                auVar20 = vmaxsd_avx(auVar21,auVar20);
                dVar19 = auVar20._0_8_;
                lVar13 = lVar13 + 1;
              } while (lVar7 + (ulong)(lVar7 == 0) != lVar13);
            }
          }
        }
        Diffs::push(&local_d0,dVar19);
        TFactor<double>::operator=
                  (local_58.
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17,&local_98);
        if (local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_98._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar17 = uVar17 + 1;
      }
      if (2 < (this->Props).verbose) {
        if (Name == (undefined *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5f93b0);
        }
        else {
          sVar10 = strlen(Name);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,puVar2,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"::run:  maxdiff ",0x10);
        iVar11._M_current = &local_d0._def;
        if (local_d0._maxsize <=
            (ulong)((long)local_d0.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_d0.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3)) {
          iVar11._M_current = local_d0._maxpos._M_current;
        }
        poVar6 = std::ostream::_M_insert<double>(*iVar11._M_current);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," after ",7);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," passes",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      uVar17 = this->_iterations + 1;
      this->_iterations = uVar17;
    } while (uVar17 < (this->Props).maxiter);
  }
  iVar11._M_current = &local_d0._def;
  iVar12._M_current = iVar11._M_current;
  if (local_d0._maxsize <=
      (ulong)((long)local_d0.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_d0.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    iVar12._M_current = local_d0._maxpos._M_current;
  }
  if (this->_maxdiff < *iVar12._M_current) {
    this->_maxdiff = *iVar12._M_current;
  }
  puVar2 = Name;
  uVar17 = (this->Props).verbose;
  if (uVar17 != 0) {
    if (*iVar12._M_current <= (this->Props).tol) {
      if (uVar17 < 3) goto LAB_004b6c45;
      if (Name == (undefined *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5f93b0);
      }
      else {
        sVar10 = strlen(Name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,puVar2,sVar10);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"::run:  converged in ",0x15);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," passes (",9);
      toc();
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," clocks).",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    }
    else {
      if (uVar17 == 1) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
      }
      puVar2 = Name;
      if (Name == (undefined *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5f93b0);
      }
      else {
        sVar10 = strlen(Name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,puVar2,sVar10);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"::run:  WARNING: not converged within ",0x26);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," passes (",9);
      toc();
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," clocks)...final maxdiff:",0x19);
      iVar12._M_current = iVar11._M_current;
      if (local_d0._maxsize <=
          (ulong)((long)local_d0.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_d0.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3)) {
        iVar12._M_current = local_d0._maxpos._M_current;
      }
      poVar6 = std::ostream::_M_insert<double>(*iVar12._M_current);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    }
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
LAB_004b6c45:
  if (local_d0._maxsize <=
      (ulong)((long)local_d0.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_d0.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    iVar11._M_current = local_d0._maxpos._M_current;
  }
  dVar19 = *iVar11._M_current;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&local_58);
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_d0.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return dVar19;
}

Assistant:

double IJGP::run() {
        if( Props.verbose >= 1 )
            cout << "Starting " << identify() << "...";
        if( Props.verbose >= 3)
           cout << endl;

        clock_t tic = toc();
        Diffs diffs(grm().nrVars(), 1.0);

        vector<size_t> edge_seq;
//      vector<double> residuals;

        vector<Factor> old_beliefs;
        old_beliefs.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            old_beliefs.push_back( belief( grm().var(i) ) );

/*      if( Props.updates == UpdateType::SEQMAX ) {
            // do the first pass
            for(size_t iI = 0; iI < grm().nrEdges(); iI++ )
                calcNewMessage(iI);

            // calculate initial residuals
            residuals.reserve(grm().nrEdges());
            for( size_t iI = 0; iI < grm().nrEdges(); iI++ )
                residuals.push_back( dist( _newmessages[iI], _messages[iI], Prob::DISTLINF ) );
        } else {*/
            edge_seq.reserve( grm().nr_Redges() );
            for( size_t e = 0; e < grm().nr_Redges(); e++ )
                edge_seq.push_back( e );
//        }

        // IJGP with parent->child message updates
        // Do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props.maxiter && diffs.max() > Props.tol; _iterations++ ) {
/*          if( Props.updates == UpdateType::SEQMAX ) {
                // Residuals-BP by Koller et al.
                for( size_t t = 0; t < grm().nrEdges(); t++ ) {
                    // update the message with the largest residual
                    size_t iI = max_element(residuals.begin(), residuals.end()) - residuals.begin();
                    updateMessage( iI );
                    residuals[iI] = 0;

                    // I->i has been updated, which means that residuals for all
                    // J->j with J in nb[i]\I and j in nb[J]\i have to be updated
                    size_t i = grm().edge(iI).first;
                    size_t I = grm().edge(iI).second;
                    for( FactorGraph::nb_cit J = grm().nbV(i).begin(); J != grm().nbV(i).end(); J++ )
                        if( *J != I )
                            for( FactorGraph::nb_cit j = grm().nbF(*J).begin(); j != grm().nbF(*J).end(); j++ )
                                if( *j != i ) {
                                    size_t jJ = grm().edge(*j,*J);
                                    calcNewMessage(jJ);
                                    residuals[jJ] = dist( _newmessages[jJ], _messages[jJ], Prob::DISTLINF );
                                }
                }
            } else if( Props.updates == UpdateType::PARALL ) {
                // Parallel updates 
                for( size_t t = 0; t < grm().nr_Redges(); t++ )
                    calcNewMessage(t);

                for( size_t t = 0; t < grm().nr_Redges(); t++ )
                    updateMessage(t);
            } else {*/
                // Sequential updates
                if( Props.updates == UpdateType::SEQRND )
                    random_shuffle( edge_seq.begin(), edge_seq.end() );

                for( size_t t = 0; t < grm().nr_Redges(); t++ )
                    updateMessage( edge_seq[t] );
//            }

            // Calc outer region beliefs
            for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ ) {
                _Qa[alpha] = grm().OR(alpha);
                for( RegionGraph::R_nb_cit beta2 = grm().nbOR(alpha).begin(); beta2 != grm().nbOR(alpha).end(); beta2++ )
                    for( RegionGraph::R_nb_cit alpha2 = grm().nbIR(*beta2).begin(); alpha2 != grm().nbIR(*beta2).end(); alpha2++ )
                        if( *alpha2 != alpha )
                            _Qa[alpha] *= message(*alpha2, *beta2);
                _Qa[alpha].normalize();
            }

            // Calc inner region beliefs
            for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) {
                _Qb[beta] = Factor();
                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ )
                    _Qb[beta] *= message(*alpha, beta);
                _Qb[beta].normalize();
            }

            // Calculate new variable beliefs and compare with old ones
            for( size_t i = 0; i < grm().nrVars(); i++ ) {
                Factor nb( belief( grm().var(i) ) );
                diffs.push( dist( nb, old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = nb;
            }

            if( Props.verbose >= 3 )
                cout << Name << "::run:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;
        }

        if( diffs.max() > _maxdiff )
            _maxdiff = diffs.max();

        if( Props.verbose >= 1 ) {
            if( diffs.max() > Props.tol ) {
                if( Props.verbose == 1 )
                    cout << endl;
                    cout << Name << "::run:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            } else {
                if( Props.verbose >= 3 )
                    cout << Name << "::run:  converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diffs.max();
    }